

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_multiview_state
          (Impl *this,Value *state,VkRenderPassMultiviewCreateInfo **out_info)

{
  undefined8 uVar1;
  VkRenderPassMultiviewCreateInfo *pVVar2;
  Number NVar3;
  Type pGVar4;
  undefined8 local_30;
  
  pVVar2 = (VkRenderPassMultiviewCreateInfo *)
           ScratchAllocator::allocate_raw(&this->allocator,0x40,0x10);
  if (pVVar2 != (VkRenderPassMultiviewCreateInfo *)0x0) {
    *(undefined8 *)&pVVar2->correlationMaskCount = 0;
    pVVar2->pCorrelationMasks = (uint32_t *)0x0;
    *(undefined8 *)&pVVar2->dependencyCount = 0;
    pVVar2->pViewOffsets = (int32_t *)0x0;
    *(undefined8 *)&pVVar2->subpassCount = 0;
    pVVar2->pViewMasks = (uint32_t *)0x0;
    *(undefined8 *)pVVar2 = 0;
    pVVar2->pNext = (void *)0x0;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffd0,(Ch *)state);
  uVar1 = local_30;
  NVar3.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(state);
  if (uVar1 != NVar3.i64) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"viewMasks");
    if ((pGVar4->data_).f.flags != 4) goto LAB_0011fd71;
    pVVar2->subpassCount = (pGVar4->data_).s.length;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"viewMasks");
    parse_uints(this,pGVar4,&pVVar2->pViewMasks);
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffd0,(Ch *)state);
  uVar1 = local_30;
  NVar3.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(state);
  if (uVar1 != NVar3.i64) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"viewOffsets");
    if ((pGVar4->data_).f.flags != 4) goto LAB_0011fd71;
    pVVar2->dependencyCount = (pGVar4->data_).s.length;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"viewOffsets");
    parse_sints(this,pGVar4,&pVVar2->pViewOffsets);
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffd0,(Ch *)state);
  NVar3.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(state);
  if (local_30 != NVar3.i64) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"correlationMasks");
    if ((pGVar4->data_).f.flags != 4) {
LAB_0011fd71:
      __assert_fail("IsArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x66a,
                    "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    pVVar2->correlationMaskCount = (pGVar4->data_).s.length;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"correlationMasks");
    parse_uints(this,pGVar4,&pVVar2->pCorrelationMasks);
  }
  *out_info = pVVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_multiview_state(const Value &state, VkRenderPassMultiviewCreateInfo **out_info)
{
	auto *info = allocator.allocate_cleared<VkRenderPassMultiviewCreateInfo>();

	if (state.HasMember("viewMasks"))
	{
		info->subpassCount = state["viewMasks"].Size();
		if (!parse_uints(state["viewMasks"], &info->pViewMasks))
			return false;
	}

	if (state.HasMember("viewOffsets"))
	{
		info->dependencyCount = state["viewOffsets"].Size();
		if (!parse_sints(state["viewOffsets"], &info->pViewOffsets))
			return false;
	}

	if (state.HasMember("correlationMasks"))
	{
		info->correlationMaskCount = state["correlationMasks"].Size();
		if (!parse_uints(state["correlationMasks"], &info->pCorrelationMasks))
			return false;
	}

	*out_info = info;
	return true;
}